

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAlgorithms.h
# Opt level: O2

void __thiscall
ContainerAlgorithms::
DefaultDeleter<std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>,_false>::operator()
          (DefaultDeleter<std::vector<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>,_false>
           *this,value_type value)

{
  if (value != (value_type)0x0) {
    cmTargetExport::~cmTargetExport(value);
  }
  operator_delete(value,0x80);
  return;
}

Assistant:

void operator()(typename Range::value_type value) const { delete value; }